

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

int32 gflags::Int32FromEnv(char *v,int32 dflt)

{
  bool bVar1;
  int32 *piVar2;
  FlagValue ifv;
  string valstr;
  
  valstr._M_dataplus._M_p = (pointer)&valstr.field_2;
  valstr._M_string_length = 0;
  valstr.field_2._M_local_buf[0] = '\0';
  bVar1 = SafeGetEnv(v,&valstr);
  if (bVar1) {
    piVar2 = (int32 *)operator_new(4);
    ifv.type_ = '\x01';
    ifv.owns_value_ = true;
    ifv.value_buffer_ = piVar2;
    bVar1 = anon_unknown_2::FlagValue::ParseFrom(&ifv,valstr._M_dataplus._M_p);
    if (!bVar1) {
      anon_unknown_2::ReportError
                (DIE,"ERROR: error parsing env variable \'%s\' with value \'%s\'\n",v,
                 valstr._M_dataplus._M_p);
    }
    dflt = *piVar2;
    anon_unknown_2::FlagValue::~FlagValue(&ifv);
  }
  std::__cxx11::string::~string((string *)&valstr);
  return dflt;
}

Assistant:

int32 Int32FromEnv(const char *v, int32 dflt) {
  return GetFromEnv(v, dflt);
}